

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

void __thiscall QFSFileEnginePrivate::unmapAll(QFSFileEnginePrivate *this)

{
  Data *pDVar1;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  QList<unsigned_char_*> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->maps).d;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = (uchar **)&DAT_aaaaaaaaaaaaaaaa;
    QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::keys(&local_38,&this->maps);
    if ((undefined1 *)local_38.d.size != (undefined1 *)0x0) {
      puVar2 = (undefined1 *)0x0;
      do {
        unmap(this,local_38.d.ptr[(long)puVar2]);
        puVar2 = puVar2 + 1;
      } while (puVar2 < (ulong)local_38.d.size);
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFSFileEnginePrivate::unmapAll()
{
    if (!maps.isEmpty()) {
        const QList<uchar*> keys = maps.keys(); // Make a copy since unmap() modifies the map.
        for (int i = 0; i < keys.size(); ++i)
            unmap(keys.at(i));
    }
}